

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int countsize(lua_State *L,int sizearray)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int iVar5;
  
  lua_pushnil(L);
  iVar1 = lua_next(L,1);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    do {
      iVar2 = lua_type(L,-2);
      iVar5 = iVar1 + 1;
      if (iVar2 == 3) {
        iVar2 = lua_isinteger(L,-2);
        if (iVar2 == 0) {
          lua_tonumberx(L,-2,(int *)0x0);
          luaL_error(L,"Invalid key %f");
        }
        lVar3 = lua_tointegerx(L,-2,(int *)0x0);
        if (sizearray < lVar3) {
          iVar1 = iVar5;
        }
        if (lVar3 < 1) {
          iVar1 = iVar5;
        }
      }
      else {
        iVar1 = iVar5;
        if (iVar2 - 6U < 0xfffffffe) {
          pcVar4 = lua_typename(L,iVar2);
          luaL_error(L,"Invalid key type %s",pcVar4);
        }
      }
      lua_settop(L,-2);
      iVar2 = lua_next(L,1);
    } while (iVar2 != 0);
  }
  return iVar1;
}

Assistant:

static int
countsize(lua_State *L, int sizearray) {
	int n = 0;
	lua_pushnil(L);
	while (lua_next(L, 1) != 0) {
		int type = lua_type(L, -2);
		++n;
		if (type == LUA_TNUMBER) {
			if (!lua_isinteger(L, -2)) {
				luaL_error(L, "Invalid key %f", lua_tonumber(L, -2));
			}
			lua_Integer nkey = lua_tointeger(L, -2);
			if (nkey > 0 && nkey <= sizearray) {
				--n;
			}
		} else if (type != LUA_TSTRING && type != LUA_TTABLE) {
			luaL_error(L, "Invalid key type %s", lua_typename(L, type));
		}
		lua_pop(L, 1);
	}

	return n;
}